

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_splitting(test_state *state,int k)

{
  int iVar1;
  byte bVar2;
  uchar *puVar3;
  long lVar4;
  
  iVar1 = state->bytes_per_sample;
  lVar4 = (long)iVar1;
  bVar2 = (byte)k;
  if ((state->strm->flags & 8) == 0) {
    if (0 < (long)state->buf_len) {
      puVar3 = state->ubuf;
      do {
        (*state->out)(puVar3,0,iVar1);
        (*state->out)(puVar3 + lVar4,~(-1L << (bVar2 & 0x3f)),iVar1);
        (*state->out)(puVar3 + iVar1 * 2,0,iVar1);
        (*state->out)(puVar3 + iVar1 * 3,~(-1L << (bVar2 + 2 & 0x3f)),iVar1);
        puVar3 = puVar3 + lVar4 * 4;
      } while (puVar3 < state->ubuf + state->buf_len);
    }
  }
  else if (0 < (long)state->buf_len) {
    puVar3 = state->ubuf;
    do {
      (*state->out)(puVar3,state->xmin + ~(-1L << (bVar2 - 1 & 0x3f)),iVar1);
      (*state->out)(puVar3 + lVar4,state->xmin,iVar1);
      (*state->out)(puVar3 + iVar1 * 2,state->xmin + ~(-1L << (bVar2 + 1 & 0x3f)),iVar1);
      (*state->out)(puVar3 + iVar1 * 3,state->xmin,iVar1);
      puVar3 = puVar3 + iVar1 * 4;
    } while (puVar3 < state->ubuf + state->buf_len);
  }
  printf("Checking splitting with k=%i ... ",k);
  iVar1 = check_block_sizes(state,k + 1,state->id_len);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int check_splitting(struct test_state *state, int k)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, state->xmin + (1ULL << (k - 1)) - 1, size);
            state->out(tmp + size, state->xmin, size);
            state->out(tmp + 2 * size, state->xmin
                       + (1ULL << (k + 1)) - 1, size);
            state->out(tmp + 3 * size, state->xmin, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, (1ULL << k) - 1, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, (1ULL << (k + 2)) - 1, size);
        }
    }

    printf("Checking splitting with k=%i ... ", k);
    status = check_block_sizes(state, k + 1, state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}